

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseDotOperator(StructuralParser *this,Expression *expression)

{
  UnqualifiedName *args_2;
  TypeMetaFunction *elementType;
  Expression *pEVar1;
  DotOperator *expression_00;
  Ptr o;
  Op metaTypeOp;
  Context context;
  Op local_3c;
  Context local_38;
  
  o.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o.object != (SourceCodeText *)0x0) {
    ((o.object)->super_RefCountedObject).refCount =
         ((o.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_38.parentScope = this->currentScope;
  local_38.location.sourceCode.object = o.object;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6e0);
  args_2 = parseUnqualifiedName(this);
  local_3c = AST::TypeMetaFunction::getOperationForName((Identifier)0x1d7325);
  if (local_3c == none) {
    expression_00 =
         PoolAllocator::
         allocate<soul::AST::DotOperator,soul::AST::Context&,soul::AST::Expression&,soul::AST::UnqualifiedName&>
                   (&this->allocator->pool,&local_38,expression,args_2);
    pEVar1 = parseSuffixes(this,&expression_00->super_Expression);
    o.object = local_38.location.sourceCode.object;
  }
  else {
    elementType = PoolAllocator::
                  allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                            (&this->allocator->pool,
                             &(args_2->super_Expression).super_Statement.super_ASTObject.context,
                             expression,&local_3c);
    pEVar1 = parseVectorOrArrayTypeSuffixes
                       (this,&elementType->super_Expression,metaFunctionArgument);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o.object);
  return pEVar1;
}

Assistant:

AST::Expression& parseDotOperator (AST::Expression& expression)
    {
        auto context = getContext();
        expect (Operator::dot);
        auto& propertyOrMethodName = parseUnqualifiedName();

        auto metaTypeOp = getOpForTypeMetaFunctionName (propertyOrMethodName);

        if (metaTypeOp != AST::TypeMetaFunction::Op::none)
            return parseVectorOrArrayTypeSuffixes (allocate<AST::TypeMetaFunction> (propertyOrMethodName.context, expression, metaTypeOp),
                                                   ParseTypeContext::metaFunctionArgument);

        return parseSuffixes (allocate<AST::DotOperator> (context, expression, propertyOrMethodName));
    }